

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O3

void __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  size_t sVar1;
  iterator __position;
  bool bVar2;
  id tid_00;
  __normal_iterator<std::thread::id_*,_std::vector<std::thread::id,_std::allocator<std::thread::id>_>_>
  _Var3;
  system_error *this_00;
  error_category *peVar4;
  error_code __ec;
  error_code __ec_00;
  id tid;
  unique_lock<std::mutex> lk;
  id local_48;
  unique_lock<std::mutex> local_40;
  native_handle_type local_30;
  
  tid_00._M_thread = pthread_self();
  local_40._M_device = &this->mtx_;
  local_40._M_owns = false;
  local_48._M_thread = tid_00._M_thread;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  if ((this->e_owner_)._M_thread != tid_00._M_thread) {
    local_30 = tid_00._M_thread;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::thread::id*,std::vector<std::thread::id,std::allocator<std::thread::id>>>,__gnu_cxx::__ops::_Iter_equals_val<std::thread::id_const>>
                      ((this->s_owner_).
                       super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
                       .super__Vector_impl_data._M_start,
                       (this->s_owner_).
                       super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
                       .super__Vector_impl_data._M_finish);
    if (_Var3._M_current ==
        (this->s_owner_).super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      while( true ) {
        sVar1 = (this->state_).rwcount;
        if (-1 < (long)sVar1) {
          if (sVar1 != 0x7fffffffffffffff) {
            (this->state_).rwcount = sVar1 + 1;
            __position._M_current =
                 (this->s_owner_).
                 super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->s_owner_).
                super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::thread::id,std::allocator<std::thread::id>>::
              _M_realloc_insert<std::thread::id_const&>
                        ((vector<std::thread::id,std::allocator<std::thread::id>> *)&this->s_owner_,
                         __position,&local_48);
              tid_00._M_thread = local_48._M_thread;
            }
            else {
              (__position._M_current)->_M_thread = tid_00._M_thread;
              (this->s_owner_).super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>
              ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            validator::deadlock::locked((uintptr_t)this,tid_00,true);
            std::unique_lock<std::mutex>::~unique_lock(&local_40);
            return;
          }
          __assert_fail("(s.rwcount & reader_mask) < reader_mask",
                        "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/yamc_rwlock_sched.hpp"
                        ,0x5b,"static void yamc::rwlock::ReaderPrefer::acquire_rlock(state &)");
        }
        bVar2 = validator::deadlock::enqueue((uintptr_t)this,tid_00,true);
        if (!bVar2) break;
        std::condition_variable::wait((unique_lock *)&this->cv_);
        validator::deadlock::dequeue((uintptr_t)this,tid_00);
      }
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      peVar4 = (error_category *)std::_V2::generic_category();
      __ec._M_cat = peVar4;
      __ec._0_8_ = 0x23;
      std::system_error::system_error(this_00,__ec,"deadlock");
      goto LAB_00196306;
    }
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  peVar4 = (error_category *)std::_V2::generic_category();
  __ec_00._M_cat = peVar4;
  __ec_00._0_8_ = 0x23;
  std::system_error::system_error(this_00,__ec_00,"recursive lock_shared");
LAB_00196306:
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void lock_shared()
  {
    const auto tid = std::this_thread::get_id();
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "recursive lock_shared");
#endif
    }
    while (RwLockPolicy::wait_rlock(state_)) {
      if (!validator::enqueue(reinterpret_cast<uintptr_t>(this), tid, true)) {
        // deadlock detection
#if YAMC_CHECKED_CALL_ABORT
        std::abort();
#else
        throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "deadlock");
#endif
      }
      cv_.wait(lk);
      validator::dequeue(reinterpret_cast<uintptr_t>(this), tid);
    }
    RwLockPolicy::acquire_rlock(state_);
    s_owner_.push_back(tid);
    validator::locked(reinterpret_cast<uintptr_t>(this), tid, true);
  }